

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.h
# Opt level: O0

Insertion_return * __thiscall
Gudhi::persistence_matrix::
Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>::
insert_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
          (Insertion_return *__return_storage_ptr__,
          Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>
          *this,ID_index cellIndex,
          vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
          *boundary,Dimension dim)

{
  uint uVar1;
  uint uVar2;
  Characteristic *pCVar3;
  logic_error *this_00;
  Dimension dim_local;
  vector<std::pair<unsigned_int,_unsigned_int>,_std::allocator<std::pair<unsigned_int,_unsigned_int>_>_>
  *boundary_local;
  ID_index cellIndex_local;
  Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
  *this_local;
  
  pCVar3 = persistence_fields::Zp_field_operators<unsigned_int,_void>::get_characteristic
                     (*(Zp_field_operators<unsigned_int,_void> **)this);
  uVar1 = *pCVar3;
  uVar2 = Matrix<Chain_barcode_options<false,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true>_>
          ::get_null_value<unsigned_int>();
  if (uVar1 != uVar2) {
    Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
    ::
    insert_boundary<std::vector<std::pair<unsigned_int,unsigned_int>,std::allocator<std::pair<unsigned_int,unsigned_int>>>>
              (__return_storage_ptr__,
               (Chain_matrix<Gudhi::persistence_matrix::Matrix<Chain_barcode_options<false,(Gudhi::persistence_matrix::Column_types)7,false,false,true>>>
                *)(this + 8),cellIndex,boundary,dim);
    return __return_storage_ptr__;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  std::logic_error::logic_error
            (this_00,
             "Matrix::insert_boundary - Columns cannot be initialized if the coefficient field characteristic is not specified."
            );
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

inline typename Matrix<PersistenceMatrixOptions>::Insertion_return
Matrix<PersistenceMatrixOptions>::insert_boundary(ID_index cellIndex,
                                                  const Boundary_range& boundary,
                                                  Dimension dim)
{
  if constexpr (!PersistenceMatrixOptions::is_z2){
    GUDHI_CHECK(colSettings_->operators.get_characteristic() != get_null_value<Characteristic>(),
                std::logic_error("Matrix::insert_boundary - Columns cannot be initialized if the coefficient field "
                                 "characteristic is not specified."));
  }

  static_assert(isNonBasic, "Only enabled for non-basic matrices.");
  if constexpr (!PersistenceMatrixOptions::is_of_boundary_type &&
                PersistenceMatrixOptions::column_indexation_type == Column_indexation_types::CONTAINER)
    return matrix_.insert_boundary(cellIndex, boundary, dim);
  else
    matrix_.insert_boundary(cellIndex, boundary, dim);
}